

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_command * nk__next(nk_context *ctx,nk_command *cmd)

{
  nk_command *next;
  nk_byte *buffer;
  nk_command *cmd_local;
  nk_context *ctx_local;
  nk_command *local_8;
  
  if (((ctx == (nk_context *)0x0) || (cmd == (nk_command *)0x0)) || (ctx->count == 0)) {
    local_8 = (nk_command *)0x0;
  }
  else if (cmd->next < (ctx->memory).allocated) {
    local_8 = (nk_command *)((long)(ctx->memory).memory.ptr + cmd->next);
  }
  else {
    local_8 = (nk_command *)0x0;
  }
  return local_8;
}

Assistant:

NK_API const struct nk_command*
nk__next(struct nk_context *ctx, const struct nk_command *cmd)
{
    nk_byte *buffer;
    const struct nk_command *next;
    NK_ASSERT(ctx);
    if (!ctx || !cmd || !ctx->count) return 0;
    if (cmd->next >= ctx->memory.allocated) return 0;
    buffer = (nk_byte*)ctx->memory.memory.ptr;
    next = nk_ptr_add_const(struct nk_command, buffer, cmd->next);
    return next;
}